

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::WriteInt16(ON_BinaryArchive *this,size_t count,ON__INT16 *p)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  
  if (this->m_endian == big_endian) {
    if (count == 0) {
      bVar3 = true;
    }
    else {
      lVar2 = count + 1;
      do {
        lVar2 = lVar2 + -1;
        bVar3 = lVar2 == 0;
        if (bVar3) {
          return bVar3;
        }
        sVar1 = Write(this,1,(void *)((long)p + 1));
        if (sVar1 != 1) {
          return bVar3;
        }
        sVar1 = Write(this,1,p);
        p = p + 1;
      } while (sVar1 == 1);
    }
  }
  else {
    sVar1 = Write(this,count * 2,p);
    bVar3 = sVar1 == count * 2;
  }
  return bVar3;
}

Assistant:

bool
ON_BinaryArchive::WriteInt16(   // Write an array of 16 bit shorts
		size_t count,               // number of shorts to write
		const ON__INT16* p
		)
{
  bool rc = true;
  if (m_endian == ON::endian::big_endian)
  {
    if ( count > 0 ) 
    {
      const char* b = (const char*)p;
      while ( rc && count-- ) 
      {
        rc = WriteByte( 1, b+1 );
        if (rc)
          rc = WriteByte( 1, b );
        b++;
        b++;
      }
    }
  }
  else 
  {
    rc = WriteByte( count<<1, p );
  }
  return rc;
}